

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void jx9HashmapExtractNodeValue(jx9_hashmap_node *pNode,jx9_value *pValue,int bStore)

{
  jx9_value *pSrc;
  jx9_value *pEntry;
  int bStore_local;
  jx9_value *pValue_local;
  jx9_hashmap_node *pNode_local;
  
  pSrc = HashmapExtractNodeValue(pNode);
  if (pSrc == (jx9_value *)0x0) {
    jx9MemObjRelease(pValue);
  }
  else if (bStore == 0) {
    jx9MemObjLoad(pSrc,pValue);
  }
  else {
    jx9MemObjStore(pSrc,pValue);
  }
  return;
}

Assistant:

JX9_PRIVATE void jx9HashmapExtractNodeValue(jx9_hashmap_node *pNode, jx9_value *pValue, int bStore)
{
	jx9_value *pEntry = HashmapExtractNodeValue(pNode);
	if( pEntry ){
		if( bStore ){
			jx9MemObjStore(pEntry, pValue);
		}else{
			jx9MemObjLoad(pEntry, pValue);
		}
	}else{
		jx9MemObjRelease(pValue);
	}
}